

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SlotManager.cpp
# Opt level: O2

void __thiscall SlotManager::SlotManager(SlotManager *this,ObjectStore *objectStore)

{
  _Rb_tree_header *p_Var1;
  size_t sVar2;
  ObjectStoreToken *pToken;
  uchar *puVar3;
  ulong uVar4;
  uint uVar5;
  ulong whichToken;
  string s;
  char *local_78 [4];
  ByteString bs;
  
  this->_vptr_SlotManager = (_func_int **)&PTR__SlotManager_0019ed38;
  p_Var1 = &(this->slots)._M_t._M_impl.super__Rb_tree_header;
  (this->slots)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->slots)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->slots)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->slots)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->slots)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  whichToken = 0;
  while( true ) {
    sVar2 = ObjectStore::getTokenCount(objectStore);
    if (sVar2 <= whichToken) break;
    pToken = ObjectStore::getToken(objectStore,whichToken);
    ByteString::ByteString(&bs);
    (*pToken->_vptr_ObjectStoreToken[7])(pToken,&bs);
    puVar3 = ByteString::const_byte_str(&bs);
    sVar2 = ByteString::size(&bs);
    s._M_dataplus._M_p = (pointer)&s.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&s,puVar3,puVar3 + sVar2);
    if (s._M_string_length < 8) {
      uVar4 = strtoul(s._M_dataplus._M_p,(char **)0x0,0x10);
      uVar5 = (uint)uVar4;
    }
    else {
      std::__cxx11::string::substr((ulong)local_78,(ulong)&s);
      uVar4 = strtoul(local_78[0],(char **)0x0,0x10);
      uVar5 = (uint)uVar4;
      std::__cxx11::string::~string((string *)local_78);
    }
    insertToken(this,objectStore,(ulong)(uVar5 & 0x7fffffff),pToken);
    std::__cxx11::string::~string((string *)&s);
    ByteString::~ByteString(&bs);
    whichToken = whichToken + 1;
  }
  sVar2 = ObjectStore::getTokenCount(objectStore);
  insertToken(this,objectStore,sVar2,(ObjectStoreToken *)0x0);
  return;
}

Assistant:

SlotManager::SlotManager(ObjectStore*const objectStore)
{
	// Add a slot for each token that already exists
	for (size_t i = 0; i < objectStore->getTokenCount(); i++)
	{
		ObjectStoreToken*const pToken(objectStore->getToken(i));
		ByteString bs;
		pToken->getTokenSerial(bs);
		const std::string s((const char*)bs.const_byte_str(), bs.size());

		// parse serial string that is expected to have only hex digits.
		CK_SLOT_ID l;
		if (s.size() < 8)
		{
			l = strtoul(s.c_str(), NULL, 16);
		}
		else
		{
			l = strtoul(s.substr(s.size() - 8).c_str(), NULL, 16);
		}

		// mask for 31 bits.
		// this since sunpkcs11 java wrapper is parsing the slot ID to a java int that needs to be positive.
		// java int is 32 bit and the the sign bit is removed.
		const CK_SLOT_ID mask( ((CK_SLOT_ID)1<<31)-1 );
		const CK_SLOT_ID slotID(mask&l);

		insertToken(objectStore, slotID, pToken);
	}

	// Add an empty slot
	insertToken(objectStore, objectStore->getTokenCount(), NULL);
}